

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::validateKTXwriterScParams
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  undefined4 in_register_00000014;
  char *pcVar1;
  char *extraout_RDX;
  int iVar2;
  optional<unsigned_long> oVar3;
  string_view text;
  optional<unsigned_long> invalidIndex;
  
  pcVar1 = (char *)CONCAT44(in_register_00000014,size);
  this->foundKTXwriterScParams = true;
  if ((size == 0) || (data[size - 1] != '\0')) {
    error<>(this,&Metadata::KTXwriterScParamsMissingNull);
    iVar2 = 0;
    pcVar1 = extraout_RDX;
  }
  else {
    iVar2 = -1;
  }
  text._M_str = pcVar1;
  text._M_len = (size_t)data;
  oVar3 = validateUTF8((ktx *)(ulong)(iVar2 + size),text);
  invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  invalidIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0
     ) {
    error<unsigned_long&>
              (this,&Metadata::KTXwriterScParamsInvalidUTF8,(unsigned_long *)&invalidIndex);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXwriterScParams(const uint8_t* data, uint32_t size) {
    foundKTXwriterScParams = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXwriterScParamsMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);
    if (auto invalidIndex = validateUTF8(value))
        error(Metadata::KTXwriterScParamsInvalidUTF8, *invalidIndex);
}